

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

void __thiscall Clasp::SharedMinimizeData::resetBounds(SharedMinimizeData *this)

{
  int iVar1;
  uint uVar2;
  LowerType *pLVar3;
  ulong uVar4;
  size_type *psVar5;
  SharedMinimizeData *pSVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  size_type *psVar11;
  pointer pLVar12;
  size_type *psVar13;
  Fill<long> local_38;
  long local_30;
  
  LOCK();
  (this->gCount_).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  this->optGen_ = 0;
  uVar4 = (ulong)(this->adjust_).ebo_.size;
  uVar7 = 0;
  if (uVar4 != 0) {
    pLVar3 = this->lower_;
    lVar8 = 0;
    do {
      LOCK();
      *(undefined8 *)((long)&(pLVar3->super___atomic_base<long>)._M_i + lVar8) = 0;
      UNLOCK();
      lVar8 = lVar8 + 8;
    } while (uVar4 << 3 != lVar8);
    uVar7 = (this->adjust_).ebo_.size;
  }
  local_30 = 0x7fffffffffffffff;
  this->up_[0].ebo_.size = 0;
  local_38.val_ = &local_30;
  bk_lib::pod_vector<long,std::allocator<long>>::
  insert_impl<unsigned_int,bk_lib::detail::Fill<long>>
            ((pod_vector<long,std::allocator<long>> *)this->up_,this->up_[0].ebo_.buf,uVar7,
             &local_38);
  uVar7 = (this->adjust_).ebo_.size;
  local_30 = 0x7fffffffffffffff;
  this->up_[1].ebo_.size = 0;
  local_38.val_ = &local_30;
  bk_lib::pod_vector<long,std::allocator<long>>::
  insert_impl<unsigned_int,bk_lib::detail::Fill<long>>
            ((pod_vector<long,std::allocator<long>> *)(this->up_ + 1),this->up_[1].ebo_.buf,uVar7,
             &local_38);
  uVar7 = (this->weights).ebo_.size;
  if (uVar7 != 0) {
    pSVar6 = this + 1;
    pLVar12 = (this->weights).ebo_.buf;
    uVar10 = 0;
    do {
      uVar4 = (ulong)uVar10;
      iVar1 = *(int *)(pLVar12 + uVar10);
      uVar9 = uVar10;
      while (iVar1 < 0) {
        uVar9 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar9;
        if (pLVar12[uVar4].weight < 0) {
          psVar5 = &pSVar6[-1].prios.ebo_.size;
          psVar13 = &(pSVar6->adjust_).ebo_.cap;
          do {
            pSVar6 = (SharedMinimizeData *)(psVar5 + 2);
            lVar8 = (long)(psVar5 + 3);
            psVar5 = (size_type *)pSVar6;
            psVar11 = psVar13;
            psVar13 = psVar13 + 2;
          } while (*(uint *)lVar8 != uVar10);
          do {
            pLVar12 = (this->weights).ebo_.buf;
            LOCK();
            this->lower_[*(uint *)(pLVar12 + uVar4) & 0x7fffffff].super___atomic_base<long>._M_i =
                 this->lower_[*(uint *)(pLVar12 + uVar4) & 0x7fffffff].super___atomic_base<long>.
                 _M_i + (long)pLVar12[uVar4].weight;
            UNLOCK();
            uVar2 = *psVar11;
            psVar11 = psVar11 + 2;
          } while (uVar2 == uVar10);
          pLVar12 = (this->weights).ebo_.buf;
        }
        iVar1 = *(int *)(pLVar12 + uVar4);
      }
      uVar10 = uVar9 + 1;
    } while (uVar10 != uVar7);
  }
  return;
}

Assistant:

void SharedMinimizeData::resetBounds() {
	gCount_  = 0;
	optGen_  = 0;
	std::fill_n(lower_, numRules(), wsum_t(0));
	up_[0].assign(numRules(), maxBound());
	up_[1].assign(numRules(), maxBound());
	const WeightLiteral* lit = lits;
	for (weight_t wPos = 0, end = (weight_t)weights.size(), x; wPos != end; wPos = x+1) {
		assert(weights[wPos].weight >= 0);
		for (x = wPos; weights[x].next; ) { // compound weight - check for negative
			if (weights[++x].weight < 0) {
				while (lit->second != wPos) { ++lit; }
				for (const WeightLiteral* t = lit; t->second == wPos; ++t) {
					lower_[weights[x].level] += weights[x].weight;
				}
			}
		}
	}
}